

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O2

ECalType icu_63::getCalendarTypeForLocale(char *locid)

{
  int32_t iVar1;
  ECalType EVar2;
  ECalType EVar3;
  UResourceBundle *resB;
  UResourceBundle *resB_00;
  UChar *us;
  UErrorCode status;
  int32_t len;
  char region [4];
  char calTypeBuf [32];
  char canonicalName [256];
  
  status = U_ZERO_ERROR;
  iVar1 = uloc_canonicalize_63(locid,canonicalName,0xff,&status);
  if (U_ZERO_ERROR < status) {
    return CALTYPE_GREGORIAN;
  }
  canonicalName[iVar1] = '\0';
  iVar1 = uloc_getKeywordValue_63(canonicalName,"calendar",calTypeBuf,0x1f,&status);
  if (status < U_ILLEGAL_ARGUMENT_ERROR) {
    calTypeBuf[iVar1] = '\0';
    EVar2 = getCalendarType(calTypeBuf);
    if (EVar2 != CALTYPE_UNKNOWN) {
      return EVar2;
    }
  }
  status = U_ZERO_ERROR;
  ulocimp_getRegionForSupplementalData_63(canonicalName,'\x01',region,4,&status);
  if (U_ZERO_ERROR < status) {
    return CALTYPE_GREGORIAN;
  }
  resB = ures_openDirect_63((char *)0x0,"supplementalData",&status);
  ures_getByKey_63(resB,"calendarPreferenceData",resB,&status);
  resB_00 = ures_getByKey_63(resB,region,(UResourceBundle *)0x0,&status);
  if (resB != (UResourceBundle *)0x0 && status == U_MISSING_RESOURCE_ERROR) {
    status = U_ZERO_ERROR;
    resB_00 = ures_getByKey_63(resB,"001",(UResourceBundle *)0x0,&status);
  }
  calTypeBuf[0] = '\0';
  if (resB_00 != (UResourceBundle *)0x0 && status < U_ILLEGAL_ARGUMENT_ERROR) {
    len = 0;
    us = ures_getStringByIndex_63(resB_00,0,&len,&status);
    if (len < 0x20) {
      u_UCharsToChars_63(us,calTypeBuf,len);
      calTypeBuf[len] = '\0';
      EVar2 = getCalendarType(calTypeBuf);
      goto LAB_001f08f9;
    }
  }
  EVar2 = CALTYPE_UNKNOWN;
LAB_001f08f9:
  ures_close_63(resB_00);
  ures_close_63(resB);
  EVar3 = CALTYPE_GREGORIAN;
  if (EVar2 != CALTYPE_UNKNOWN) {
    EVar3 = EVar2;
  }
  return EVar3;
}

Assistant:

static ECalType getCalendarTypeForLocale(const char *locid) {
    UErrorCode status = U_ZERO_ERROR;
    ECalType calType = CALTYPE_UNKNOWN;

    //TODO: ULOC_FULL_NAME is out of date and too small..
    char canonicalName[256];

    // canonicalize, so grandfathered variant will be transformed to keywords
    // e.g ja_JP_TRADITIONAL -> ja_JP@calendar=japanese
    int32_t canonicalLen = uloc_canonicalize(locid, canonicalName, sizeof(canonicalName) - 1, &status);
    if (U_FAILURE(status)) {
        return CALTYPE_GREGORIAN;
    }
    canonicalName[canonicalLen] = 0;    // terminate

    char calTypeBuf[32];
    int32_t calTypeBufLen;

    calTypeBufLen = uloc_getKeywordValue(canonicalName, "calendar", calTypeBuf, sizeof(calTypeBuf) - 1, &status);
    if (U_SUCCESS(status)) {
        calTypeBuf[calTypeBufLen] = 0;
        calType = getCalendarType(calTypeBuf);
        if (calType != CALTYPE_UNKNOWN) {
            return calType;
        }
    }
    status = U_ZERO_ERROR;

    // when calendar keyword is not available or not supported, read supplementalData
    // to get the default calendar type for the locale's region
    char region[ULOC_COUNTRY_CAPACITY];
    (void)ulocimp_getRegionForSupplementalData(canonicalName, TRUE, region, sizeof(region), &status);
    if (U_FAILURE(status)) {
        return CALTYPE_GREGORIAN;
    }

    // Read preferred calendar values from supplementalData calendarPreference
    UResourceBundle *rb = ures_openDirect(NULL, "supplementalData", &status);
    ures_getByKey(rb, "calendarPreferenceData", rb, &status);
    UResourceBundle *order = ures_getByKey(rb, region, NULL, &status);
    if (status == U_MISSING_RESOURCE_ERROR && rb != NULL) {
        status = U_ZERO_ERROR;
        order = ures_getByKey(rb, "001", NULL, &status);
    }

    calTypeBuf[0] = 0;
    if (U_SUCCESS(status) && order != NULL) {
        // the first calender type is the default for the region
        int32_t len = 0;
        const UChar *uCalType = ures_getStringByIndex(order, 0, &len, &status);
        if (len < (int32_t)sizeof(calTypeBuf)) {
            u_UCharsToChars(uCalType, calTypeBuf, len);
            *(calTypeBuf + len) = 0; // terminate;
            calType = getCalendarType(calTypeBuf);
        }
    }

    ures_close(order);
    ures_close(rb);

    if (calType == CALTYPE_UNKNOWN) {
        // final fallback
        calType = CALTYPE_GREGORIAN;
    }
    return calType;
}